

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

int gmlc::utilities::stringOps::findCloseStringMatch
              (stringVector *testStrings,stringVector *inputStrings,string_match_type matchType)

{
  string_view input;
  int iVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  pointer pbVar3;
  long lVar4;
  string lct;
  string lcis;
  stringVector lciStrings;
  string nstr;
  
  lct._M_dataplus._M_p = (pointer)&lct.field_2;
  lct._M_string_length = 0;
  lct.field_2._M_local_buf[0] = '\0';
  lcis._M_dataplus._M_p = (pointer)&lcis.field_2;
  lcis._M_string_length = 0;
  lcis.field_2._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&lciStrings,inputStrings);
  pbVar2 = lciStrings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = lciStrings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    makeLowerCase(pbVar3);
  }
  pbVar2 = (testStrings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (testStrings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar2 == pbVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lciStrings);
      std::__cxx11::string::~string((string *)&lcis);
      std::__cxx11::string::~string((string *)&lct);
      return -1;
    }
    input._M_str = (char *)lct._M_string_length;
    input._M_len = (size_t)lct._M_dataplus._M_p;
    convertToLowerCase_abi_cxx11_(input);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&lct,&nstr);
    std::__cxx11::string::~string((string *)&nstr);
    for (lVar4 = 0;
        lVar4 < (int)((ulong)((long)lciStrings.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)lciStrings.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar4 = lVar4 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&lcis,lciStrings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4);
      if (matchType < 4) {
        iVar1 = (*(code *)(&DAT_003a4a30 + *(int *)(&DAT_003a4a30 + (ulong)matchType * 4)))();
        return iVar1;
      }
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

int findCloseStringMatch(
        const stringVector& testStrings,
        const stringVector& inputStrings,
        string_match_type matchType)
    {
        std::string lct;  // lower case test string
        std::string lcis;  // lower case input string
        stringVector lciStrings = inputStrings;
        // make all the input strings lower case
        for (auto& str : lciStrings) {
            makeLowerCase(str);
        }
        for (const auto& testStr : testStrings) {
            lct = convertToLowerCase(testStr);
            for (int kk = 0; kk < static_cast<int>(lciStrings.size()); ++kk) {
                lcis = lciStrings[kk];
                if (checkForMatch(lct, lcis, matchType)) {
                    return kk;
                }
            }
        }
        return -1;
    }